

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O3

QPoint QHighDpi::fromNativePixels<QPoint,QScreen>(QPoint *value,QScreen *context)

{
  bool bVar1;
  bool bVar2;
  QPoint QVar3;
  double dVar4;
  double dVar5;
  ScaleAndOrigin SVar6;
  
  SVar6 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  dVar4 = 1.0 / SVar6.factor;
  dVar5 = (double)((value->xp).m_i - SVar6.origin.xp.m_i) * dVar4;
  dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  bVar1 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  dVar4 = (double)((value->yp).m_i - SVar6.origin.yp.m_i) * dVar4;
  dVar4 = (double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4;
  bVar2 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  QVar3.yp.m_i = SVar6.origin.yp.m_i +
                 (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar4);
  QVar3.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar5) +
                 SVar6.origin.xp.m_i;
  return QVar3;
}

Assistant:

T fromNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, qreal(1) / so.factor, so.origin);
}